

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O2

void __thiscall
XInputSimulatorImplLinux::mouseGetPosition(XInputSimulatorImplLinux *this,int *x,int *y)

{
  Display *pDVar1;
  uint mask;
  int winY;
  int winX;
  int rootY;
  int rootX;
  Window child;
  Window root;
  
  pDVar1 = this->display;
  XQueryPointer(pDVar1,*(undefined8 *)
                        (*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80),
                &root,&child,&rootX,&rootY,&winX,&winY,&mask);
  *x = rootX;
  *y = rootY;
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseGetPosition(int &x, int &y)
{
    Window root, child;
    int rootX, rootY, winX, winY;
    unsigned int mask;

    XQueryPointer(display,DefaultRootWindow(display),&root,&child,
                &rootX,&rootY,&winX,&winY,&mask);

    x = rootX;
    y = rootY;
}